

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

StringOrCallback * __thiscall
google::protobuf::io::Printer::ValueImpl<true>::
ToStringOrCallback<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*)::__1,void>
          (variant<std::__cxx11::string,std::function<bool()>> *__return_storage_ptr__,
          ValueImpl<true> *this,undefined8 *cb)

{
  anon_class_40_2_a93b23f4 local_70;
  function<bool_()> local_48;
  undefined8 *local_28;
  anon_class_32_4_44e209d0_for_cb *cb_local;
  ValueImpl<true> *this_local;
  variant<std::__cxx11::string,std::function<bool()>> *local_10;
  
  local_70.cb.this = (MessageGenerator *)*cb;
  local_70.cb.p = (Printer **)cb[1];
  local_70.cb.ordered_fields =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)cb[2];
  local_70.cb.sorted_extensions =
       (vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        *)cb[3];
  local_70.is_called = false;
  local_28 = cb;
  cb_local = (anon_class_32_4_44e209d0_for_cb *)this;
  local_10 = __return_storage_ptr__;
  std::function<bool()>::
  function<google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*)::__1,void>(google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::protobuf::io::Printer*)::__1&&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)::_lambda()_1_,void>
            ((function<bool()> *)&local_48,&local_70);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (__return_storage_ptr__,&local_48);
  std::function<bool_()>::~function(&local_48);
  return (StringOrCallback *)__return_storage_ptr__;
}

Assistant:

auto Printer::ValueImpl<owned>::ToStringOrCallback(Cb&& cb, Rank2)
    -> StringOrCallback {
  return Callback(
      [cb = std::forward<Cb>(cb), is_called = false]() mutable -> bool {
        if (is_called) {
          // Catch whether or not this function is being called recursively.
          return false;
        }
        is_called = true;
        cb();
        is_called = false;
        return true;
      });
}